

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_GIF.cpp
# Opt level: O3

Am_Generic_Image * Am_GIF_Image::Create(char *filename)

{
  unsigned_short uVar1;
  int iVar2;
  Am_Generic_Image *this;
  uchar *puVar3;
  Am_RGB_Value *pAVar4;
  ulong uVar5;
  GIF_Load_Info gli;
  uchar buf [256];
  ifstream ifs;
  GIF_Load_Info local_346;
  byte local_338 [3];
  byte local_335;
  ushort local_334;
  ushort local_332;
  byte local_330;
  long local_230 [4];
  byte abStack_210 [488];
  
  this = (Am_Generic_Image *)operator_new(0x20);
  (this->iminfo).width = 0;
  (this->iminfo).height = 0;
  (this->iminfo).depth = 0;
  *(undefined8 *)((long)&(this->iminfo).depth + 1) = 0;
  *(undefined8 *)&(this->iminfo).raw_transparent_color_index = 0;
  *(undefined8 *)((long)&this->color_map + 6) = 0;
  *(undefined2 *)((long)&this->imdata + 6) = 0;
  std::ifstream::ifstream(local_230,filename,_S_in);
  if ((abStack_210[*(long *)(local_230[0] + -0x18)] & 5) == 0) {
    (this->iminfo).depth = 8;
    std::istream::read((char *)local_230,(long)&local_346);
    if ((local_346.hdr.signature[2] == 'F' && local_346.hdr.signature._0_2_ == 0x4947) ||
       (local_346.hdr.version[0] == '8')) {
      std::istream::read((char *)local_230,(long)local_338);
      if ((char)(byte)local_334 < '\0') {
        load_gif_colormap((Am_GIF_Image *)this,(ifstream *)local_230,(uint)(byte)local_334);
      }
      while (iVar2 = std::istream::get(), iVar2 == 0x21) {
        iVar2 = std::istream::get();
        if (iVar2 == 0xf9) {
          std::istream::get();
          std::istream::read((char *)local_230,(long)local_338);
          if ((local_338[0] & 1) != 0) {
            (this->iminfo).transparent = true;
            (this->iminfo).raw_transparent_color_index = (ushort)local_335;
          }
        }
        else if (iVar2 != 0xfe) {
          std::istream::get();
          std::istream::read((char *)local_230,(long)local_338);
        }
        while (iVar2 = std::istream::get(), iVar2 != 0) {
          std::istream::read((char *)local_230,(long)local_338);
        }
      }
      if (iVar2 == 0x2c) {
        std::istream::read((char *)local_230,(long)local_338);
        (this->iminfo).width = local_334;
        (this->iminfo).height = local_332;
        local_346.interlaced = local_330 >> 6 & 1;
        puVar3 = (uchar *)operator_new__(((ulong)local_332 + 10) * (ulong)local_334);
        this->imdata = puVar3;
        if ((char)local_330 < '\0') {
          load_gif_colormap((Am_GIF_Image *)this,(ifstream *)local_230,(uint)local_330);
        }
        if (((this->iminfo).transparent == true) &&
           (pAVar4 = this->color_map, pAVar4 != (Am_RGB_Value *)0x0)) {
          uVar5 = (ulong)(this->iminfo).raw_transparent_color_index;
          if (uVar5 != 0) {
            pAVar4[uVar5].blue = pAVar4->blue;
            uVar1 = pAVar4->green;
            pAVar4[uVar5].red = pAVar4->red;
            pAVar4[uVar5].green = uVar1;
            pAVar4 = this->color_map;
          }
          pAVar4->red = 0xff;
          pAVar4->green = 0xff;
          pAVar4->blue = 0xff;
        }
        iVar2 = process_gif((Am_GIF_Image *)this,(ifstream *)local_230,&local_346);
        if (iVar2 != 0) goto LAB_0019f69a;
      }
      else if (iVar2 == 0x3b) goto LAB_0019f69a;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"** error reading gif file.\n",0x1b);
    }
  }
  Am_Generic_Image::~Am_Generic_Image(this);
  operator_delete(this);
  this = (Am_Generic_Image *)0x0;
LAB_0019f69a:
  std::ifstream::~ifstream(local_230);
  return this;
}

Assistant:

Am_Generic_Image *
Am_GIF_Image::Create(const char *filename)
{
  Am_GIF_Image *im = new Am_GIF_Image;
  if (im == nullptr)
    return nullptr; // couldn't allocate the temp_image.
  GIF_Load_Info gli;

  // Buffer to hold a block of image data from the GIF file.
  unsigned char buf[256];

  // Open file for reading
  std::ifstream ifs(filename, std::ios::in);

  if (!ifs) {
    delete im;
    return nullptr;
  }

  // all Am_GIF_Image images have depth 8
  im->iminfo.depth = 8;

  // Read GIF header
  // ifs.read((unsigned char*)&gli.hdr, GIF_SIG_LEN); MSL
  ifs.read((char *)&gli.hdr, GIF_SIG_LEN);

  // Check if image file format is acceptable
  if (strncmp(gli.hdr.signature, "GIF", 3) != 0 && gli.hdr.version[0] != '8') {
    delete im;
    return nullptr;
  }

  // Read the logical screen descriptor.  We only use the flags field.
  // ifs.read(buf, GIF_SD_SIZE); MSL
  ifs.read((char *)buf, GIF_SD_SIZE);
  int flag = buf[4];

  // If a global color table is present, read it.
  if (flag & HAS_CT) {
    if (!(im->load_gif_colormap(ifs, flag))) {
      delete im;
      return nullptr;
    }
  }

  // Next comes a series of graphics blocks or special-purpose
  // blocks
  int byte = 0, read_an_image = 0;
  while (!read_an_image && (byte = ifs.get()) != GIF_TRAILER) {
    // Locate an image descriptor and read the image data
    int c;
    switch (byte) {
    case GIF_EXTSTART: {
      c = ifs.get();
      if (c == GIF_COMMENT) {
      } else if (c == GIF_GCE) {
        c = ifs.get(); // BlockSize always 4
        // ifs.read(buf, GIF_GCE_SIZE); MSL
        ifs.read((char *)buf, GIF_GCE_SIZE);
        flag = buf[GIF_GCE_PACKED];
        if (flag & TRANSPARENT) {
          im->iminfo.transparent = true;
          im->iminfo.raw_transparent_color_index = buf[GIF_GCE_COLORINDEX];
        }
      } else {
        int blksize = ifs.get();
        // ifs.read(buf, blksize); MSL
        ifs.read((char *)buf, blksize);
      }
      while ((c = ifs.get()) != 0)
        //ifs.read(buf, c); MSL
        ifs.read((char *)buf, c);
      break;
    }
    case GIF_IMGSTART: {
      // Read GIF image information
      // ifs.read(buf, GIF_ID_SIZE); MSL
      ifs.read((char *)buf, GIF_ID_SIZE);
      im->iminfo.width = (buf[5] << 8) + buf[4];
      im->iminfo.height = (buf[7] << 8) + buf[6];
      flag = buf[8];

      gli.interlaced = (flag & INTERLACED) ? 1 : 0;

      // Allocate memory for the GIF image and read in GIF image
      // into this array
      im->imdata = new unsigned char[(long)(im->iminfo.width) *
                                     (long)(im->iminfo.height + 10)];
      if (im->imdata == nullptr) { // failed to allocate image data
        delete im;
        return nullptr;
      }

      // Read local color table, if any
      if (flag & HAS_CT) {
        if (!(im->load_gif_colormap(ifs, flag))) {
          delete im;
          return nullptr;
        }
      }

      // force index of transparent color to be 0
      // to support X stipple raster ops
      if (im->iminfo.transparent) {
        im->adjust_colormap();
      }

      // Process the encoded data stream from the file.
      if (!(im->process_gif(ifs, gli))) {
        std::cerr << "** error reading gif file.\n";
        delete im;
        return nullptr;
      };
      read_an_image = 1;
      break;
    }
    default: {
      std::cerr << "** error reading gif file.\n";
      delete im;
      return nullptr;
    }
    }
  }
  // Success!
  return im;
}